

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::RenderPassVkImpl::RenderPassVkImpl
          (RenderPassVkImpl *this,IReferenceCounters *pRefCounters,RenderDeviceVkImpl *pDevice,
          RenderPassDesc *Desc,bool IsDeviceInternal)

{
  element_type *peVar1;
  ShadingRateAttachment **ppSVar2;
  ulong uVar3;
  bool bVar4;
  string msg;
  
  RenderPassBase<Diligent::EngineVkImplTraits>::RenderPassBase
            (&this->super_RenderPassBase<Diligent::EngineVkImplTraits>,pRefCounters,pDevice,Desc,
             IsDeviceInternal);
  (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
  .super_ObjectBase<Diligent::IRenderPassVk>.super_RefCountedObject<Diligent::IRenderPassVk>.
  super_IRenderPassVk.super_IRenderPass.super_IDeviceObject =
       (IDeviceObject)&PTR_QueryInterface_00a510c0;
  (this->m_VkRenderPass).m_VkObject = (VkRenderPass_T *)0x0;
  (this->m_VkRenderPass).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_VkRenderPass).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (pDevice->m_LogicalVkDevice).
           super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((peVar1->m_EnabledExtFeatures).ShadingRate.attachmentFragmentShadingRate != 0) {
    ppSVar2 = &((this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                .m_Desc.pSubpasses)->pShadingRateAttachment;
    bVar4 = true;
    for (uVar3 = 0;
        (bVar4 && (uVar3 < (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                           super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                           .m_Desc.SubpassCount)); uVar3 = uVar3 + 1) {
      bVar4 = *ppSVar2 == (ShadingRateAttachment *)0x0;
      ppSVar2 = ppSVar2 + 9;
    }
    if (!bVar4) {
      if ((peVar1->m_EnabledExtFeatures).RenderPass2 == false) {
        FormatString<char[73]>
                  (&msg,(char (*) [73])
                        "This render pass requires RenderPass2 Vulkan feature that is not enabled");
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"RenderPassVkImpl",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassVkImpl.cpp"
                   ,0x39);
        std::__cxx11::string::~string((string *)&msg);
      }
      CreateRenderPass<2ul>(this);
      return;
    }
  }
  CreateRenderPass<1ul>(this);
  return;
}

Assistant:

RenderPassVkImpl::RenderPassVkImpl(IReferenceCounters*   pRefCounters,
                                   RenderDeviceVkImpl*   pDevice,
                                   const RenderPassDesc& Desc,
                                   bool                  IsDeviceInternal) :
    TRenderPassBase{pRefCounters, pDevice, Desc, IsDeviceInternal}
{
    const auto& ExtFeats = pDevice->GetLogicalDevice().GetEnabledExtFeatures();

    size_t RenderPassVersion = 1;
    if (ExtFeats.ShadingRate.attachmentFragmentShadingRate)
    {
        for (Uint32 i = 0; i < m_Desc.SubpassCount && RenderPassVersion < 2; ++i)
        {
            const auto& Subpass{m_Desc.pSubpasses[i]};
            if (Subpass.pShadingRateAttachment != nullptr)
                RenderPassVersion = 2;
        }
        DEV_CHECK_ERR(RenderPassVersion < 2 || ExtFeats.RenderPass2 != VK_FALSE,
                      "This render pass requires RenderPass2 Vulkan feature that is not enabled");
    }
    else if (ExtFeats.FragmentDensityMap.fragmentDensityMap)
    {
        // Fragment density map is defined through RenderPassCI.pNext
    }


    switch (RenderPassVersion)
    {
        case 1: CreateRenderPass<1>(); break;
        case 2: CreateRenderPass<2>(); break;
        default: UNSUPPORTED("Unsupported render pass version");
    }
}